

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall QDockAreaLayoutInfo::unnest(QDockAreaLayoutInfo *this,int index)

{
  reference pQVar1;
  qsizetype qVar2;
  QDockAreaLayoutItem *pQVar3;
  QDockAreaLayoutInfo *tmp;
  QDockAreaLayoutItem *child;
  QDockAreaLayoutItem *item;
  qsizetype in_stack_ffffffffffffffb8;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffc0;
  QDockAreaLayoutInfo *pQVar4;
  
  pQVar1 = QList<QDockAreaLayoutItem>::operator[]
                     ((QList<QDockAreaLayoutItem> *)in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffb8);
  if ((pQVar1->subinfo != (QDockAreaLayoutInfo *)0x0) &&
     (qVar2 = QList<QDockAreaLayoutItem>::size(&pQVar1->subinfo->item_list), qVar2 < 2)) {
    qVar2 = QList<QDockAreaLayoutItem>::size(&pQVar1->subinfo->item_list);
    if (qVar2 == 0) {
      QList<QDockAreaLayoutItem>::removeAt
                ((QList<QDockAreaLayoutItem> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    else {
      qVar2 = QList<QDockAreaLayoutItem>::size(&pQVar1->subinfo->item_list);
      if (qVar2 == 1) {
        pQVar3 = QList<QDockAreaLayoutItem>::first
                           ((QList<QDockAreaLayoutItem> *)in_stack_ffffffffffffffc0);
        if (pQVar3->widgetItem == (QLayoutItem *)0x0) {
          if (pQVar3->subinfo != (QDockAreaLayoutInfo *)0x0) {
            pQVar4 = pQVar1->subinfo;
            pQVar1->subinfo = pQVar3->subinfo;
            pQVar3->subinfo = (QDockAreaLayoutInfo *)0x0;
            QList<QDockAreaLayoutItem>::clear
                      ((QList<QDockAreaLayoutItem> *)in_stack_ffffffffffffffc0);
            if (pQVar4 != (QDockAreaLayoutInfo *)0x0) {
              ~QDockAreaLayoutInfo(pQVar4);
              operator_delete(pQVar4,0x70);
            }
          }
        }
        else {
          pQVar1->widgetItem = pQVar3->widgetItem;
          pQVar4 = pQVar1->subinfo;
          if (pQVar4 != (QDockAreaLayoutInfo *)0x0) {
            ~QDockAreaLayoutInfo(in_stack_ffffffffffffffc0);
            operator_delete(pQVar4,0x70);
          }
          pQVar1->subinfo = (QDockAreaLayoutInfo *)0x0;
        }
      }
    }
  }
  return;
}

Assistant:

void QDockAreaLayoutInfo::unnest(int index)
{
    QDockAreaLayoutItem &item = item_list[index];
    if (item.subinfo == nullptr)
        return;
    if (item.subinfo->item_list.size() > 1)
        return;

    if (item.subinfo->item_list.size() == 0) {
        item_list.removeAt(index);
    } else if (item.subinfo->item_list.size() == 1) {
        QDockAreaLayoutItem &child = item.subinfo->item_list.first();
        if (child.widgetItem != nullptr) {
            item.widgetItem = child.widgetItem;
            delete item.subinfo;
            item.subinfo = nullptr;
        } else if (child.subinfo != nullptr) {
            QDockAreaLayoutInfo *tmp = item.subinfo;
            item.subinfo = child.subinfo;
            child.subinfo = nullptr;
            tmp->item_list.clear();
            delete tmp;
        }
    }
}